

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O0

Value __thiscall xmrig::Pools::toJSON(Pools *this,Document *doc)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  long in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value VVar2;
  Pool *pool;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *__range1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *pools;
  Document *in_stack_000000e0;
  Pool *in_stack_000000e8;
  undefined4 in_stack_ffffffffffffff78;
  Type in_stack_ffffffffffffff7c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_58;
  reference local_48;
  Pool *local_40;
  __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
  local_38;
  long local_30;
  undefined1 local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_RDI,in_stack_ffffffffffffff7c);
  local_30 = in_RSI + 8;
  local_38._M_current =
       (Pool *)std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::begin
                         ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_40 = (Pool *)std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::end
                               ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
               ::operator*(&local_38);
    Pool::toJSON(in_stack_000000e8,in_stack_000000e0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack(in_RDI,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x1d164d);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_58);
    __gnu_cxx::
    __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
    ::operator++(&local_38);
  }
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::Pools::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value pools(kArrayType);

    for (const Pool &pool : m_data) {
        pools.PushBack(pool.toJSON(doc), allocator);
    }

    return pools;
}